

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.hpp
# Opt level: O1

void __thiscall
SequenceDistanceGraph::SequenceDistanceGraph
          (SequenceDistanceGraph *this,SequenceDistanceGraph *param_1)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>_>_>
  local_38;
  
  (this->super_DistanceGraph).sdg = (param_1->super_DistanceGraph).sdg;
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::vector(&(this->super_DistanceGraph).links,&(param_1->super_DistanceGraph).links);
  (this->super_DistanceGraph).name._M_dataplus._M_p =
       (pointer)&(this->super_DistanceGraph).name.field_2;
  pcVar1 = (param_1->super_DistanceGraph).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_DistanceGraph).name,pcVar1,
             pcVar1 + (param_1->super_DistanceGraph).name._M_string_length);
  std::vector<Node,_std::allocator<Node>_>::vector(&this->nodes,&param_1->nodes);
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (param_1->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar1,pcVar1 + (param_1->filename)._M_string_length);
  (this->fasta_filename)._M_dataplus._M_p = (pointer)&(this->fasta_filename).field_2;
  pcVar1 = (param_1->fasta_filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fasta_filename,pcVar1,
             pcVar1 + (param_1->fasta_filename)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->oldnames,&param_1->oldnames);
  local_38._M_h = (__hashtable_alloc *)&this->oldnames_to_ids;
  (this->oldnames_to_ids)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->oldnames_to_ids)._M_h._M_bucket_count = (param_1->oldnames_to_ids)._M_h._M_bucket_count;
  (this->oldnames_to_ids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->oldnames_to_ids)._M_h._M_element_count = (param_1->oldnames_to_ids)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(param_1->oldnames_to_ids)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (param_1->oldnames_to_ids)._M_h._M_rehash_policy._M_next_resize;
  (this->oldnames_to_ids)._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->oldnames_to_ids)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->oldnames_to_ids)._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->oldnames_to_ids)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->oldnames_to_ids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,long>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_38._M_h,&(param_1->oldnames_to_ids)._M_h,&local_38);
  this->ws = param_1->ws;
  return;
}

Assistant:

explicit SequenceDistanceGraph(WorkSpace & _ws):nodes(0),DistanceGraph(*this,"SDG"),ws(_ws) { //sdg gets initialised through LDG
        add_node(Node("",NodeStatus::Deleted)); //an empty deleted node on 0, just to skip the space
    }